

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void init_options(void)

{
  nh_option_desc *pnVar1;
  int local_c;
  wchar_t i;
  
  pnVar1 = find_option("name");
  (pnVar1->field_4).i.max = 0x20;
  pnVar1 = find_option("dungeon_name");
  (pnVar1->field_4).e.choices = dungeon_name_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = dungeon_name_spec._8_8_;
  pnVar1 = find_option("menu_headings");
  (pnVar1->field_4).e.choices = menu_headings_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = menu_headings_spec._8_8_;
  pnVar1 = find_option("msgheight");
  (pnVar1->field_4).i.min = 0;
  pnVar1 = find_option("msgheight");
  (pnVar1->field_4).i.max = 0x28;
  pnVar1 = find_option("msghistory");
  (pnVar1->field_4).i.min = 0x14;
  pnVar1 = find_option("msghistory");
  (pnVar1->field_4).i.max = 20000;
  pnVar1 = find_option("graphics");
  (pnVar1->field_4).e.choices = graphics_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = graphics_spec._8_8_;
  pnVar1 = find_option("optstyle");
  (pnVar1->field_4).e.choices = optstyle_spec.choices;
  *(undefined8 *)((long)&pnVar1->field_4 + 8) = optstyle_spec._8_8_;
  pnVar1 = find_option("scores_top");
  (pnVar1->field_4).i.max = 10000;
  pnVar1 = find_option("scores_around");
  (pnVar1->field_4).i.max = 100;
  nh_setup_ui_options(curses_options,boolopt_map,option_change_callback);
  local_c = 0;
  while (curses_options[local_c].name != (char *)0x0) {
    nh_set_option(curses_options[local_c].name,curses_options[local_c].value.s,0);
    local_c = local_c + 1;
  }
  read_ui_config();
  return;
}

Assistant:

void init_options(void)
{
    int i;

    find_option("name")->s.maxlen = PL_NSIZ;
    find_option("dungeon_name")->e = dungeon_name_spec;
    find_option("menu_headings")->e = menu_headings_spec;
    find_option("msgheight")->i.min = 0;
    find_option("msgheight")->i.max = MAX_MSGLINES;
    find_option("msghistory")->i.min = 20;   /* arbitrary min/max values */
    find_option("msghistory")->i.max = 20000;
    find_option("graphics")->e = graphics_spec;
    find_option("optstyle")->e = optstyle_spec;
    find_option("scores_top")->i.max = 10000;
    find_option("scores_around")->i.max = 100;
    nh_setup_ui_options(curses_options, boolopt_map, option_change_callback);
    
    /* set up option defaults; this is necessary for options that are not
     * specified in the config file */
    for (i = 0; curses_options[i].name; i++)
	nh_set_option(curses_options[i].name, curses_options[i].value, FALSE);
    
    read_ui_config();
}